

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O3

UniValue * BIP22ValidationResult(UniValue *__return_storage_ptr__,BlockValidationState *state)

{
  ModeState MVar1;
  pointer pcVar2;
  UniValue *extraout_RAX;
  UniValue *pUVar3;
  long in_FS_OFFSET;
  string strRejectReason;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  UniValue *local_28;
  
  local_28 = *(UniValue **)(in_FS_OFFSET + 0x28);
  MVar1 = (state->super_ValidationState<BlockValidationResult>).m_mode;
  if (MVar1 == M_VALID) {
    __return_storage_ptr__->typ = VNULL;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->val)._M_string_length = 0;
    pUVar3 = *(UniValue **)(in_FS_OFFSET + 0x28);
    if (pUVar3 == local_28) {
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      return pUVar3;
    }
  }
  else if (MVar1 == M_INVALID) {
    pcVar2 = (state->super_ValidationState<BlockValidationResult>).m_reject_reason._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,
               pcVar2 + (state->super_ValidationState<BlockValidationResult>).m_reject_reason.
                        _M_string_length);
    if (local_48._M_string_length == 0) {
      UniValue::UniValue<const_char_(&)[9],_char[9],_true>
                (__return_storage_ptr__,(char (*) [9])0x7ffb3d);
    }
    else {
      UniValue::
      UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_28) {
      return *(UniValue **)(in_FS_OFFSET + 0x28);
    }
  }
  else if (MVar1 == M_ERROR) {
    pUVar3 = (UniValue *)__cxa_allocate_exception(0x58);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_48,&state->super_ValidationState<BlockValidationResult>);
    JSONRPCError(pUVar3,-0x19,&local_48);
    if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(pUVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else if (*(UniValue **)(in_FS_OFFSET + 0x28) == local_28) {
    UniValue::UniValue<const_char_(&)[7],_char[7],_true>
              (__return_storage_ptr__,(char (*) [7])"valid?");
    return extraout_RAX;
  }
  __stack_chk_fail();
}

Assistant:

static UniValue BIP22ValidationResult(const BlockValidationState& state)
{
    if (state.IsValid())
        return UniValue::VNULL;

    if (state.IsError())
        throw JSONRPCError(RPC_VERIFY_ERROR, state.ToString());
    if (state.IsInvalid())
    {
        std::string strRejectReason = state.GetRejectReason();
        if (strRejectReason.empty())
            return "rejected";
        return strRejectReason;
    }
    // Should be impossible
    return "valid?";
}